

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_dma_heap.c
# Opt level: O1

MPP_RET os_allocator_dma_heap_free(void *ctx,MppBufferInfo *data)

{
  MPP_RET MVar1;
  
  if (ctx == (void *)0x0) {
    _mpp_log_l(2,"mpp_dma_heap","does not accept NULL input\n","os_allocator_dma_heap_free");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    if (((byte)dma_heap_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dma_heap","dev %d free  %3d size %d ptr %p\n",(char *)0x0,
                 (ulong)*(uint *)((long)ctx + 4),(ulong)(uint)data->fd,(int)data->size,
                 *(undefined4 *)&data->ptr);
    }
    if (data->ptr != (void *)0x0) {
      munmap(data->ptr,data->size);
      data->ptr = (void *)0x0;
    }
    close(data->fd);
    MVar1 = MPP_OK;
  }
  return MVar1;
}

Assistant:

static MPP_RET os_allocator_dma_heap_free(void *ctx, MppBufferInfo *data)
{
    allocator_ctx_dmaheap *p = NULL;
    MPP_RET ret = MPP_OK;

    if (NULL == ctx) {
        mpp_err_f("does not accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    p = (allocator_ctx_dmaheap *)ctx;

    dma_heap_dbg_ops("dev %d free  %3d size %d ptr %p\n", p->device,
                     data->fd, data->size, data->ptr);

    if (data->ptr) {
        munmap(data->ptr, data->size);
        data->ptr = NULL;
    }
    close(data->fd);

    return ret;
}